

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetString_Test::
TestBody(MicroStringPrevTest_AssignmentViaSetString_Test *this)

{
  Arena *pAVar1;
  MicroString *this_00;
  ParamType *pPVar2;
  size_t sVar3;
  Arena *pAVar4;
  char *message;
  bool allocated_on_arena;
  string_view sVar5;
  MicroString source;
  MicroString local_78;
  size_t local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string_view local_58;
  string_view local_48;
  size_t local_38;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  pAVar1 = &(this->super_MicroStringPrevTest).arena_;
  pAVar4 = (Arena *)0x0;
  if ((pPVar2->
      super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
      ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
    pAVar4 = pAVar1;
  }
  local_78 = MicroStringPrevTest::MakeFromState(kString,pAVar4);
  local_70 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  this_00 = &(this->super_MicroStringPrevTest).str_;
  local_38 = MicroString::SpaceUsedExcludingSelfLong(this_00);
  sVar3 = MicroString::Capacity(this_00);
  sVar5 = MicroString::Get(&local_78);
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if (((*(uint *)&(this->super_MicroStringPrevTest).str_.rep_ | (uint)local_78.rep_) & 3) == 0) {
    this_00->rep_ = local_78.rep_;
  }
  else {
    pAVar4 = (Arena *)0x0;
    if ((pPVar2->
        super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
        ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
      pAVar4 = pAVar1;
    }
    MicroString::SetFromOtherSlow(this_00,&local_78,pAVar4,7);
  }
  local_48 = MicroString::Get(this_00);
  local_58 = MicroString::Get(&local_78);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (local_68,"str_.Get()","source.Get()",&local_48,&local_58);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x307,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  allocated_on_arena = sVar3 < sVar5._M_len;
  sVar3 = local_38;
  if (allocated_on_arena) {
    sVar5 = MicroString::Get(this_00);
    sVar3 = sVar5._M_len + 2;
  }
  MicroStringPrevTest::ExpectMemoryUsed
            (&this->super_MicroStringPrevTest,local_70,allocated_on_arena,sVar3,(MicroString *)0x0);
  pPVar2 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if (((pPVar2->
       super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
       ).super__Head_base<0UL,_bool,_false>._M_head_impl == false) &&
     (((ulong)local_78.rep_ & 3) != 0)) {
    MicroString::DestroySlow(&local_78);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetString) {
  MicroString source = MakeFromState(kString, arena());

  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  const bool will_reuse = str_.Capacity() >= source.Get().size();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  } else {
    ExpectMemoryUsed(used, true, kMicroRepSize + str_.Get().size());
  }

  if (!has_arena()) source.Destroy();
}